

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *t)

{
  bool bVar1;
  int index;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  
  index = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::size
                    ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x52f733);
  do {
    index = index + -1;
    if (index < 0) {
      return true;
    }
    RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Get(in_RDI,index);
    bVar1 = FieldDescriptorProto::IsInitialized
                      ((FieldDescriptorProto *)CONCAT44(index,in_stack_ffffffffffffffe8));
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}